

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall
QPDF::checkHPageOffset
          (QPDF *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *shared_idx_to_obj)

{
  size_t *this_00;
  int iVar1;
  pointer piVar2;
  ulong uVar3;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_01;
  bool bVar4;
  pointer pMVar5;
  const_reference pvVar6;
  size_type sVar7;
  QPDFObjGen QVar8;
  size_t sVar9;
  qpdf_offset_t __val;
  reference pvVar10;
  size_type sVar11;
  mapped_type *__x;
  reference pvVar12;
  reference piVar13;
  size_type sVar14;
  string_view sVar15;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar16;
  string local_680;
  string local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  string_view local_5c0;
  int local_5ac;
  iterator iStack_5a8;
  int iter_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2_1;
  string local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string_view local_4d0;
  int local_4bc;
  iterator iStack_4b8;
  int iter;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  int local_490;
  allocator<char> local_489;
  int obj;
  int local_464;
  ulong uStack_460;
  int idx_1;
  size_t i_1;
  undefined1 local_450;
  allocator<char> local_441;
  string local_440;
  value_type local_41c;
  ulong uStack_418;
  int idx;
  size_t i;
  undefined1 local_400 [8];
  set<int,_std::less<int>,_std::allocator<int>_> computed_shared;
  set<int,_std::less<int>,_std::allocator<int>_> hint_shared;
  string local_380;
  string local_360;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string_view local_220;
  long local_210;
  int local_208;
  int local_204;
  int h_length;
  int length;
  string local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string_view local_100;
  int local_ec;
  reference pvStack_e8;
  int h_nobjects;
  CHPageOffsetEntry *ce;
  HPageOffsetEntry *he;
  allocator<char> local_c9;
  string local_c8;
  int local_a8;
  QPDFObjGen QStack_a4;
  int first_object;
  QPDFObjGen page_og;
  int pageno;
  qpdf_offset_t offset;
  allocator<char> local_61;
  string local_60;
  QPDFObjGen local_40;
  QPDFObjGen first_page_og;
  qpdf_offset_t table_offset;
  int local_24;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmStack_20;
  int npages;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *shared_idx_to_obj_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages_local;
  QPDF *this_local;
  
  pmStack_20 = shared_idx_to_obj;
  shared_idx_to_obj_local =
       (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)pages;
  pages_local = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this;
  table_offset = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(pages);
  local_24 = toI<unsigned_long>((unsigned_long *)&table_offset);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  first_page_og = (QPDFObjGen)adjusted_offset(this,(pMVar5->page_offset_hints).first_page_offset);
  pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                      shared_idx_to_obj_local,0);
  local_40 = QPDFObjectHandle::getObjGen(pvVar6);
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  sVar7 = std::
          map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::count(&pMVar5->xref_table,&local_40);
  if (sVar7 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"supposed first page object is not known",&local_61);
    stopOnError(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  QVar8 = (QPDFObjGen)getLinearizationOffset(this,local_40);
  if (first_page_og != QVar8) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&page_og.gen,
               "first page object offset mismatch");
    linearizationWarning(this,stack0xffffffffffffff68);
  }
  for (page_og.obj = 0; this_01 = shared_idx_to_obj_local, page_og.obj < local_24;
      page_og.obj = page_og.obj + 1) {
    sVar9 = toS<int>(&page_og.obj);
    pvVar6 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_01,sVar9
                       );
    QStack_a4 = QPDFObjectHandle::getObjGen(pvVar6);
    local_a8 = QPDFObjGen::getObj(&stack0xffffffffffffff5c);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar7 = std::
            map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::count(&pMVar5->xref_table,&stack0xffffffffffffff5c);
    if (sVar7 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"unknown object in page offset hint table",&local_c9);
      stopOnError(this,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    stack0xffffffffffffff2c = QStack_a4;
    __val = getLinearizationOffset(this,QStack_a4);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar9 = toS<int>(&page_og.obj);
    ce = (CHPageOffsetEntry *)
         std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                   (&(pMVar5->page_offset_hints).entries,sVar9);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar9 = toS<int>(&page_og.obj);
    pvStack_e8 = std::vector<QPDF::CHPageOffsetEntry,_std::allocator<QPDF::CHPageOffsetEntry>_>::at
                           (&(pMVar5->c_page_offset_data).entries,sVar9);
    iVar1 = ce->nobjects;
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    local_ec = iVar1 + (pMVar5->page_offset_hints).min_nobjects;
    if (local_ec != pvStack_e8->nobjects) {
      std::__cxx11::to_string(&local_1c0,page_og.obj);
      std::operator+(&local_1a0,"object count mismatch for page ",&local_1c0);
      std::operator+(&local_180,&local_1a0,": hint table = ");
      std::__cxx11::to_string(&local_1e0,local_ec);
      std::operator+(&local_160,&local_180,&local_1e0);
      std::operator+(&local_140,&local_160,"; computed = ");
      std::__cxx11::to_string((string *)&h_length,pvStack_e8->nobjects);
      std::operator+(&local_120,&local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h_length)
      ;
      sVar15 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_120);
      local_100 = sVar15;
      linearizationWarning(this,sVar15);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&h_length);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    local_204 = lengthNextN(this,local_a8,local_ec);
    piVar2 = (ce->shared_identifiers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    local_210 = (long)piVar2 + (long)(pMVar5->page_offset_hints).min_page_length;
    local_208 = toI<long_long>(&local_210);
    if (local_204 != local_208) {
      std::__cxx11::to_string(&local_340,page_og.obj);
      std::operator+(&local_320,"page length mismatch for page ",&local_340);
      std::operator+(&local_300,&local_320,": hint table = ");
      std::__cxx11::to_string(&local_360,local_208);
      std::operator+(&local_2e0,&local_300,&local_360);
      std::operator+(&local_2c0,&local_2e0,"; computed length = ");
      std::__cxx11::to_string(&local_380,local_204);
      std::operator+(&local_2a0,&local_2c0,&local_380);
      std::operator+(&local_280,&local_2a0," (offset = ");
      std::__cxx11::to_string
                ((string *)&hint_shared._M_t._M_impl.super__Rb_tree_header._M_node_count,__val);
      std::operator+(&local_260,&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &hint_shared._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::operator+(&local_240,&local_260,")");
      sVar15 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_240);
      local_220 = sVar15;
      linearizationWarning(this,sVar15);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string
                ((string *)&hint_shared._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_340);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &computed_shared._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_400);
    if ((page_og.obj == 0) &&
       (0 < *(int *)&(ce->shared_identifiers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&i,
                 "page 0 has shared identifier entries");
      linearizationWarning(this,_i);
    }
    uStack_418 = 0;
    while( true ) {
      uVar3 = uStack_418;
      sVar9 = toS<int>((int *)&(ce->shared_identifiers).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
      if (sVar9 <= uVar3) break;
      pvVar10 = std::vector<int,_std::allocator<int>_>::at
                          ((vector<int,_std::allocator<int>_> *)
                           &(ce->shared_identifiers).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,uStack_418);
      local_41c = *pvVar10;
      sVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               count(pmStack_20,&local_41c);
      if (sVar11 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_440,"unable to get object for item in shared objects hint table"
                   ,&local_441);
        stopOnError(this,&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator(&local_441);
      }
      __x = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[](pmStack_20,&local_41c);
      pVar16 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          &computed_shared._M_t._M_impl.super__Rb_tree_header._M_node_count,__x);
      i_1 = (size_t)pVar16.first._M_node;
      local_450 = pVar16.second;
      uStack_418 = uStack_418 + 1;
    }
    uStack_460 = 0;
    while( true ) {
      uVar3 = uStack_460;
      sVar9 = toS<int>(&pvStack_e8->nshared_objects);
      if (sVar9 <= uVar3) break;
      pvVar10 = std::vector<int,_std::allocator<int>_>::at
                          (&pvStack_e8->shared_identifiers,uStack_460);
      iVar1 = *pvVar10;
      local_464 = iVar1;
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      if ((pMVar5->c_shared_object_data).nshared_total <= iVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&obj,"index out of bounds for shared object hint table",&local_489);
        stopOnError(this,(string *)&obj);
        std::__cxx11::string::~string((string *)&obj);
        std::allocator<char>::~allocator(&local_489);
      }
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      sVar9 = toS<int>(&local_464);
      pvVar12 = std::vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>::
                at(&(pMVar5->c_shared_object_data).entries,sVar9);
      local_490 = pvVar12->object;
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_400,&local_490);
      uStack_460 = uStack_460 + 1;
    }
    this_00 = &computed_shared._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
    iStack_4b8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00);
    while( true ) {
      bVar4 = std::operator!=(&__end2,&stack0xfffffffffffffb48);
      if (!bVar4) break;
      piVar13 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      local_4bc = *piVar13;
      sVar14 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_400,&local_4bc);
      if (sVar14 == 0) {
        std::__cxx11::to_string(&local_570,page_og.obj);
        std::operator+(&local_550,"page ",&local_570);
        std::operator+(&local_530,&local_550,": shared object ");
        std::__cxx11::to_string((string *)&__range2_1,local_4bc);
        std::operator+(&local_510,&local_530,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range2_1);
        std::operator+(&local_4f0,&local_510,": in hint table but not computed list");
        sVar15 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4f0);
        local_4d0 = sVar15;
        linearizationWarning(this,sVar15);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&__range2_1);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_570);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
    __end2_1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_400);
    iStack_5a8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_400);
    while( true ) {
      bVar4 = std::operator!=(&__end2_1,&stack0xfffffffffffffa58);
      if (!bVar4) break;
      piVar13 = std::_Rb_tree_const_iterator<int>::operator*(&__end2_1);
      local_5ac = *piVar13;
      sVar14 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          &computed_shared._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_5ac);
      if (sVar14 == 0) {
        std::__cxx11::to_string(&local_660,page_og.obj);
        std::operator+(&local_640,"page ",&local_660);
        std::operator+(&local_620,&local_640,": shared object ");
        std::__cxx11::to_string(&local_680,local_5ac);
        std::operator+(&local_600,&local_620,&local_680);
        std::operator+(&local_5e0,&local_600,": in computed list but not hint table");
        sVar15 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_5e0);
        local_5c0 = sVar15;
        linearizationWarning(this,sVar15);
        std::__cxx11::string::~string((string *)&local_5e0);
        std::__cxx11::string::~string((string *)&local_600);
        std::__cxx11::string::~string((string *)&local_680);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::~string((string *)&local_640);
        std::__cxx11::string::~string((string *)&local_660);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end2_1);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_400);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &computed_shared._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void
QPDF::checkHPageOffset(
    std::vector<QPDFObjectHandle> const& pages, std::map<int, int>& shared_idx_to_obj)
{
    // Implementation note 126 says Acrobat always sets delta_content_offset and
    // delta_content_length in the page offset header dictionary to 0.  It also states that
    // min_content_offset in the per-page information is always 0, which is an incorrect value.

    // Implementation note 127 explains that Acrobat always sets item 8 (min_content_length) to
    // zero, item 9 (nbits_delta_content_length) to the value of item 5 (nbits_delta_page_length),
    // and item 7 of each per-page hint table (delta_content_length) to item 2 (delta_page_length)
    // of that entry.  Acrobat ignores these values when reading files.

    // Empirically, it also seems that Acrobat sometimes puts items under a page's /Resources
    // dictionary in with shared objects even when they are private.

    int npages = toI(pages.size());
    qpdf_offset_t table_offset = adjusted_offset(m->page_offset_hints.first_page_offset);
    QPDFObjGen first_page_og(pages.at(0).getObjGen());
    if (m->xref_table.count(first_page_og) == 0) {
        stopOnError("supposed first page object is not known");
    }
    qpdf_offset_t offset = getLinearizationOffset(first_page_og);
    if (table_offset != offset) {
        linearizationWarning("first page object offset mismatch");
    }

    for (int pageno = 0; pageno < npages; ++pageno) {
        QPDFObjGen page_og(pages.at(toS(pageno)).getObjGen());
        int first_object = page_og.getObj();
        if (m->xref_table.count(page_og) == 0) {
            stopOnError("unknown object in page offset hint table");
        }
        offset = getLinearizationOffset(page_og);

        HPageOffsetEntry& he = m->page_offset_hints.entries.at(toS(pageno));
        CHPageOffsetEntry& ce = m->c_page_offset_data.entries.at(toS(pageno));
        int h_nobjects = he.delta_nobjects + m->page_offset_hints.min_nobjects;
        if (h_nobjects != ce.nobjects) {
            // This happens with pdlin when there are thumbnails.
            linearizationWarning(
                "object count mismatch for page " + std::to_string(pageno) + ": hint table = " +
                std::to_string(h_nobjects) + "; computed = " + std::to_string(ce.nobjects));
        }

        // Use value for number of objects in hint table rather than computed value if there is a
        // discrepancy.
        int length = lengthNextN(first_object, h_nobjects);
        int h_length = toI(he.delta_page_length + m->page_offset_hints.min_page_length);
        if (length != h_length) {
            // This condition almost certainly indicates a bad hint table or a bug in this code.
            linearizationWarning(
                "page length mismatch for page " + std::to_string(pageno) + ": hint table = " +
                std::to_string(h_length) + "; computed length = " + std::to_string(length) +
                " (offset = " + std::to_string(offset) + ")");
        }

        offset += h_length;

        // Translate shared object indexes to object numbers.
        std::set<int> hint_shared;
        std::set<int> computed_shared;

        if ((pageno == 0) && (he.nshared_objects > 0)) {
            // pdlin and Acrobat both do this even though the spec states clearly and unambiguously
            // that they should not.
            linearizationWarning("page 0 has shared identifier entries");
        }

        for (size_t i = 0; i < toS(he.nshared_objects); ++i) {
            int idx = he.shared_identifiers.at(i);
            if (shared_idx_to_obj.count(idx) == 0) {
                stopOnError("unable to get object for item in shared objects hint table");
            }
            hint_shared.insert(shared_idx_to_obj[idx]);
        }

        for (size_t i = 0; i < toS(ce.nshared_objects); ++i) {
            int idx = ce.shared_identifiers.at(i);
            if (idx >= m->c_shared_object_data.nshared_total) {
                stopOnError("index out of bounds for shared object hint table");
            }
            int obj = m->c_shared_object_data.entries.at(toS(idx)).object;
            computed_shared.insert(obj);
        }

        for (int iter: hint_shared) {
            if (!computed_shared.count(iter)) {
                // pdlin puts thumbnails here even though it shouldn't
                linearizationWarning(
                    "page " + std::to_string(pageno) + ": shared object " + std::to_string(iter) +
                    ": in hint table but not computed list");
            }
        }

        for (int iter: computed_shared) {
            if (!hint_shared.count(iter)) {
                // Acrobat does not put some things including at least built-in fonts and procsets
                // here, at least in some cases.
                linearizationWarning(
                    ("page " + std::to_string(pageno) + ": shared object " + std::to_string(iter) +
                     ": in computed list but not hint table"));
            }
        }
    }
}